

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

bool Js::AssertBooleanProperty(DynamicObject *state,PropertyIds propertyId)

{
  BOOL BVar1;
  JavascriptBoolean *this;
  DynamicObject *state_local;
  PropertyIds propertyId_local;
  
  this = AssertProperty<Js::JavascriptBoolean>(state,propertyId);
  BVar1 = JavascriptBoolean::GetValue(this);
  return BVar1 != 0;
}

Assistant:

static bool AssertBooleanProperty(_In_ DynamicObject *state, _In_ PropertyIds propertyId)
    {
        return AssertProperty<JavascriptBoolean>(state, propertyId)->GetValue();
    }